

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 matchOther)

{
  byte bVar1;
  byte bVar2;
  u32 uVar3;
  u32 uVar4;
  size_t sVar5;
  uint in_ECX;
  byte *pbVar6;
  byte *in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  bool bVar8;
  int invert;
  int seen;
  u32 prior_c;
  int bMatch_2;
  int bMatch_1;
  int bMatch;
  u8 *zEscaped;
  u8 noCase;
  u32 matchAll;
  u32 matchOne;
  u32 c2;
  u32 c;
  char zStop [3];
  uint local_80;
  u32 local_78;
  bool local_72;
  uint local_70;
  uint local_6c;
  uint local_60;
  byte *local_50;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar9;
  byte *local_18;
  undefined2 local_b;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = 0xaaaaaaaa;
  uVar9 = (uint)in_RDX[1];
  bVar1 = *in_RDX;
  bVar2 = in_RDX[3];
  local_50 = (byte *)0x0;
  local_18 = in_RDI;
  do {
    while( true ) {
      if (*local_18 < 0x80) {
        local_6c = (uint)*local_18;
        local_18 = local_18 + 1;
      }
      else {
        local_6c = sqlite3Utf8Read(&local_18);
      }
      if (local_6c == 0) {
        uVar9 = (uint)(*in_RSI != 0);
        goto LAB_00145203;
      }
      if (local_6c == bVar1) goto LAB_00144c51;
      if (local_6c == in_ECX) break;
LAB_00145121:
      if (*in_RSI < 0x80) {
        local_80 = (uint)*in_RSI;
        in_RSI = in_RSI + 1;
      }
      else {
        local_80 = sqlite3Utf8Read((uchar **)&stack0xffffffffffffffe0);
      }
      if ((local_6c != local_80) &&
         ((((bVar2 == 0 || (""[local_6c & 0xff] != ""[local_80 & 0xff])) ||
           ((0x7f < local_6c || (0x7f < local_80)))) &&
          (((local_6c != uVar9 || (local_18 == local_50)) || (local_80 == 0)))))) {
        uVar9 = 1;
        goto LAB_00145203;
      }
    }
    if (in_RDX[2] == 0) {
      local_6c = sqlite3Utf8Read(&local_18);
      if (local_6c != 0) {
        local_50 = local_18;
        goto LAB_00145121;
      }
      uVar9 = 1;
      goto LAB_00145203;
    }
    local_60 = 0;
    bVar8 = false;
    uVar3 = sqlite3Utf8Read((uchar **)&stack0xffffffffffffffe0);
    if (uVar3 == 0) {
      uVar9 = 1;
      goto LAB_00145203;
    }
    local_80 = sqlite3Utf8Read(&local_18);
    bVar7 = local_80 == 0x5e;
    if (bVar7) {
      local_80 = sqlite3Utf8Read(&local_18);
    }
    if (local_80 == 0x5d) {
      bVar8 = uVar3 == 0x5d;
      local_80 = sqlite3Utf8Read(&local_18);
    }
    while (local_80 != 0 && local_80 != 0x5d) {
      if ((((local_80 == 0x2d) && (*local_18 != 0x5d)) && (*local_18 != 0)) && (local_60 != 0)) {
        uVar4 = sqlite3Utf8Read(&local_18);
        if ((local_60 <= uVar3) && (uVar3 <= uVar4)) {
          bVar8 = true;
        }
        local_60 = 0;
      }
      else {
        local_60 = local_80;
        if (uVar3 == local_80) {
          bVar8 = true;
        }
      }
      local_80 = sqlite3Utf8Read(&local_18);
    }
  } while ((local_80 != 0) && (bVar8 != bVar7));
  uVar9 = 1;
  goto LAB_00145203;
  while ((local_70 != uVar9 ||
         (uVar3 = sqlite3Utf8Read((uchar **)&stack0xffffffffffffffe0), uVar3 != 0))) {
LAB_00144c51:
    if (*local_18 < 0x80) {
      local_70 = (uint)*local_18;
      local_18 = local_18 + 1;
    }
    else {
      local_70 = sqlite3Utf8Read(&local_18);
    }
    local_72 = true;
    if (local_70 != bVar1) {
      local_72 = local_70 == uVar9 && uVar9 != 0;
    }
    if (!local_72) {
      if (local_70 == 0) {
        uVar9 = 0;
        goto LAB_00145203;
      }
      if (local_70 == in_ECX) {
        if (in_RDX[2] != 0) goto LAB_00144d4e;
        local_70 = sqlite3Utf8Read(&local_18);
        if (local_70 == 0) {
          uVar9 = 2;
          goto LAB_00145203;
        }
      }
      if (0x7f < local_70) goto LAB_00144ede;
      local_9 = 0xaa;
      if (bVar2 == 0) {
        local_b = (ushort)(byte)local_70;
      }
      else {
        local_b = CONCAT11(""[local_70 & 0xff],(byte)local_70 & (""[local_70 & 0xff] & 0x20 ^ 0xff))
        ;
        local_9 = 0;
      }
      goto LAB_00144e69;
    }
  }
  uVar9 = 2;
  goto LAB_00145203;
LAB_00144d4e:
  if (*in_RSI != 0) {
    uVar9 = patternCompare(in_RSI,(u8 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),(compareInfo *)CONCAT44(in_ECX,local_70),local_80)
    ;
    if (uVar9 != 1) goto LAB_00145203;
    pbVar6 = in_RSI + 1;
    bVar1 = *in_RSI;
    in_RSI = pbVar6;
    if (0xbf < bVar1) {
      for (; in_RSI = pbVar6, (*pbVar6 & 0xc0) == 0x80; pbVar6 = pbVar6 + 1) {
      }
    }
    goto LAB_00144d4e;
  }
  uVar9 = 2;
  goto LAB_00145203;
  while ((local_78 != local_70 ||
         (uVar9 = patternCompare(in_RSI,(u8 *)CONCAT44(in_stack_ffffffffffffffdc,
                                                       in_stack_ffffffffffffffd8),
                                 (compareInfo *)CONCAT44(in_ECX,local_70),local_78), uVar9 == 1))) {
LAB_00144ede:
    if (*in_RSI < 0x80) {
      local_78 = (u32)*in_RSI;
      in_RSI = in_RSI + 1;
    }
    else {
      local_78 = sqlite3Utf8Read((uchar **)&stack0xffffffffffffffe0);
    }
    if (local_78 == 0) goto LAB_00144f65;
  }
  goto LAB_00145203;
LAB_00144f65:
  uVar9 = 2;
  goto LAB_00145203;
  while( true ) {
    in_RSI = in_RSI + sVar5 + 1;
    uVar9 = patternCompare(in_RSI,(u8 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ),(compareInfo *)CONCAT44(in_ECX,local_70),local_80)
    ;
    if (uVar9 != 1) break;
LAB_00144e69:
    sVar5 = strcspn((char *)in_RSI,(char *)&local_b);
    if (in_RSI[sVar5] == 0) goto LAB_00144f65;
  }
LAB_00145203:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return uVar9;
  }
  __stack_chk_fail();
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 matchOther                   /* The escape char (LIKE) or '[' (GLOB) */
){
  u32 c, c2;                       /* Next pattern and input string chars */
  u32 matchOne = pInfo->matchOne;  /* "?" or "_" */
  u32 matchAll = pInfo->matchAll;  /* "*" or "%" */
  u8 noCase = pInfo->noCase;       /* True if uppercase==lowercase */
  const u8 *zEscaped = 0;          /* One past the last escaped input char */

  while( (c = Utf8Read(zPattern))!=0 ){
    if( c==matchAll ){  /* Match "*" */
      /* Skip over multiple "*" characters in the pattern.  If there
      ** are also "?" characters, skip those as well, but consume a
      ** single character of the input string for each "?" skipped */
      while( (c=Utf8Read(zPattern)) == matchAll
             || (c == matchOne && matchOne!=0) ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return SQLITE_NOWILDCARDMATCH;
        }
      }
      if( c==0 ){
        return SQLITE_MATCH;   /* "*" at the end of the pattern matches */
      }else if( c==matchOther ){
        if( pInfo->matchSet==0 ){
          c = sqlite3Utf8Read(&zPattern);
          if( c==0 ) return SQLITE_NOWILDCARDMATCH;
        }else{
          /* "[...]" immediately follows the "*".  We have to do a slow
          ** recursive search in this case, but it is an unusual case. */
          assert( matchOther<0x80 );  /* '[' is a single-byte character */
          while( *zString ){
            int bMatch = patternCompare(&zPattern[-1],zString,pInfo,matchOther);
            if( bMatch!=SQLITE_NOMATCH ) return bMatch;
            SQLITE_SKIP_UTF8(zString);
          }
          return SQLITE_NOWILDCARDMATCH;
        }
      }

      /* At this point variable c contains the first character of the
      ** pattern string past the "*".  Search in the input string for the
      ** first matching character and recursively continue the match from
      ** that point.
      **
      ** For a case-insensitive search, set variable cx to be the same as
      ** c but in the other case and search the input string for either
      ** c or cx.
      */
      if( c<0x80 ){
        char zStop[3];
        int bMatch;
        if( noCase ){
          zStop[0] = sqlite3Toupper(c);
          zStop[1] = sqlite3Tolower(c);
          zStop[2] = 0;
        }else{
          zStop[0] = c;
          zStop[1] = 0;
        }
        while(1){
          zString += strcspn((const char*)zString, zStop);
          if( zString[0]==0 ) break;
          zString++;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }else{
        int bMatch;
        while( (c2 = Utf8Read(zString))!=0 ){
          if( c2!=c ) continue;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }
      return SQLITE_NOWILDCARDMATCH;
    }
    if( c==matchOther ){
      if( pInfo->matchSet==0 ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ) return SQLITE_NOMATCH;
        zEscaped = zPattern;
      }else{
        u32 prior_c = 0;
        int seen = 0;
        int invert = 0;
        c = sqlite3Utf8Read(&zString);
        if( c==0 ) return SQLITE_NOMATCH;
        c2 = sqlite3Utf8Read(&zPattern);
        if( c2=='^' ){
          invert = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==']' ){
          if( c==']' ) seen = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        while( c2 && c2!=']' ){
          if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
            c2 = sqlite3Utf8Read(&zPattern);
            if( c>=prior_c && c<=c2 ) seen = 1;
            prior_c = 0;
          }else{
            if( c==c2 ){
              seen = 1;
            }
            prior_c = c2;
          }
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==0 || (seen ^ invert)==0 ){
          return SQLITE_NOMATCH;
        }
        continue;
      }
    }
    c2 = Utf8Read(zString);
    if( c==c2 ) continue;
    if( noCase  && sqlite3Tolower(c)==sqlite3Tolower(c2) && c<0x80 && c2<0x80 ){
      continue;
    }
    if( c==matchOne && zPattern!=zEscaped && c2!=0 ) continue;
    return SQLITE_NOMATCH;
  }
  return *zString==0 ? SQLITE_MATCH : SQLITE_NOMATCH;
}